

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O3

void __thiscall QOpenGLShaderPrivate::~QOpenGLShaderPrivate(QOpenGLShaderPrivate *this)

{
  Data *pDVar1;
  
  *(undefined ***)this = &PTR__QOpenGLShaderPrivate_001a1168;
  operator_delete(this->glfuncs,8);
  if (this->shaderGuard != (QOpenGLSharedResourceGuard *)0x0) {
    QOpenGLSharedResource::free();
  }
  pDVar1 = (this->log).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->log).d.d)->super_QArrayData,2,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QOpenGLShaderPrivate::~QOpenGLShaderPrivate()
{
    delete glfuncs;
    if (shaderGuard)
        shaderGuard->free();
}